

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetic.c
# Opt level: O2

void genfluxterm(Reaction *r,int type,int n)

{
  Rterm *pRVar1;
  Item *item;
  Symbol *sym;
  ulong uVar2;
  char *pcVar3;
  
  pRVar1 = r->rterm[0];
  item = r->position;
  if (pRVar1->isstate == 0) {
    diag(pRVar1->sym->name," must be (solved) STATE in flux reaction");
  }
  sprintf(buf,"D%s",pRVar1->sym->name);
  sym = lookup(buf);
  if (pRVar1->sym->varnum < ncons) {
    diag(pRVar1->sym->name," is conserved and has a flux");
  }
  insertstr(item,"f_flux = b_flux = 0.;\n");
  if (type == 0) {
    insertsym(item,sym);
    if (pRVar1->str != (char *)0x0) {
      sprintf(buf,"[%s]");
      goto LAB_0010cfdd;
    }
  }
  else {
    sprintf(buf,"_RHS%d(",(ulong)(uint)n);
    insertstr(item,buf);
    uVar2 = (ulong)(uint)pRVar1->sym->varnum;
    if (pRVar1->str == (char *)0x0) {
      sprintf(buf,"%d)",uVar2);
    }
    else {
      sprintf(buf,"%d + %s)",uVar2);
    }
LAB_0010cfdd:
    insertstr(item,buf);
  }
  if (r->krate[0] == (char *)0x0) {
    insertstr(item,"+= (b_flux = ");
    pcVar3 = r->krate[1];
  }
  else {
    sprintf(buf," -= (f_flux = (%s) * ");
    insertstr(item,buf);
    insertsym(item,pRVar1->sym);
    if (pRVar1->str == (char *)0x0) goto LAB_0010d072;
    sprintf(buf,"[%s]");
    pcVar3 = buf;
  }
  insertstr(item,pcVar3);
LAB_0010d072:
  insertstr(item,");\n");
  if ((type != 0) && (r->krate[0] != (char *)0x0)) {
    sprintf(buf," _MATELM%d(",(ulong)(uint)n);
    insertstr(item,buf);
    pcVar3 = pRVar1->str;
    uVar2 = (ulong)(uint)pRVar1->sym->varnum;
    if (pcVar3 == (char *)0x0) {
      sprintf(buf,"%d, %d)",uVar2,uVar2);
    }
    else {
      sprintf(buf,"%d + %s, %d + %s",uVar2,pcVar3,uVar2,pcVar3);
    }
    insertstr(item,buf);
    sprintf(buf,"+= %s;\n",r->krate[0]);
    insertstr(item,buf);
    return;
  }
  return;
}

Assistant:

void genfluxterm(r, type, n)
	Reaction *r;
	int type;
	int n;
{
	Symbol *s;
	Rterm *rt;
	Item *q;

	q = r->position;
	rt = r->rterm[0];
	if (!(rt->isstate)) {
		diag(rt->sym->name, " must be (solved) STATE in flux reaction");
	}
	Sprintf(buf, "D%s", rt->sym->name);
	s = lookup(buf);
	if (rt->sym->varnum < ncons)
		diag(rt->sym->name, " is conserved and has a flux");
	/* the right hand side */
	Insertstr(q, "f_flux = b_flux = 0.;\n");
	if (type) {
		Sprintf(buf, "_RHS%d(", n);
		Insertstr(q, buf);
		if (rt->str) {
			Sprintf(buf, "%d + %s)", rt->sym->varnum, rt->str);
		} else {
			Sprintf(buf, "%d)", rt->sym->varnum);
		}
		Insertstr(q, buf);
	}else{
		Insertsym(q, s);/*needs processing in cout*/
		if (rt->str) {
			Sprintf(buf, "[%s]", rt->str);
			Insertstr(q, buf);
		}
	}
	if (r->krate[0]) {
		Sprintf(buf, " -= (f_flux = (%s) * ", r->krate[0]);
		Insertstr(q, buf);
		Insertsym(q, rt->sym);
		if (rt->str) {
			Sprintf(buf, "[%s]", rt->str);
			Insertstr(q, buf);
		}
	}else{
		Insertstr(q, "+= (b_flux = ");
		Insertstr(q, r->krate[1]);
	}
	Insertstr(q, ");\n");

	/* the matrix coefficient */
	if (type && r->krate[0]) {
		Sprintf(buf, " _MATELM%d(", n);
		Insertstr(q, buf);
		if (rt->str) {
			Sprintf(buf, "%d + %s, %d + %s", rt->sym->varnum, rt->str,
				rt->sym->varnum, rt->str);
		}else{
			Sprintf(buf, "%d, %d)",
				rt->sym->varnum, rt->sym->varnum);
		}
		Insertstr(q, buf);
		Sprintf(buf, "+= %s;\n", r->krate[0]);
		Insertstr(q, buf);
	}
}